

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O3

void __thiscall Assimp::ObjFileParser::getNewMaterial(ObjFileParser *this)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  iterator iVar5;
  Logger *this_00;
  byte *pbVar6;
  Model *pMVar7;
  string strMat;
  key_type local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pbVar6 = (byte *)(this->m_DataIt)._M_current;
  pbVar1 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar4 = pbVar1 + -1;
  if (pbVar4 != pbVar6 && pbVar6 != pbVar1) {
    do {
      if (((ulong)*pbVar6 < 0x21) && ((0x100003601U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))
      goto LAB_004141c6;
      pbVar6 = pbVar6 + 1;
    } while ((pbVar6 != pbVar1) && (pbVar6 != pbVar4));
  }
LAB_004141d3:
  (this->m_DataIt)._M_current = (char *)pbVar6;
  if (pbVar4 != pbVar6 && pbVar6 != pbVar1) {
    do {
      if (((*pbVar6 != 0x20) && (*pbVar6 != 9)) || (pbVar6 = pbVar6 + 1, pbVar6 == pbVar1)) break;
    } while (pbVar6 != pbVar4);
  }
  (this->m_DataIt)._M_current = (char *)pbVar6;
  if (pbVar6 != pbVar1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,pbVar6,pbVar6 + (char)*pbVar6);
    pbVar4 = (byte *)(this->m_DataIt)._M_current;
    while (((pbVar4 != (byte *)(this->m_DataItEnd)._M_current && ((ulong)*pbVar4 < 0x21)) &&
           ((0x100003601U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
      pbVar4 = pbVar4 + 1;
      (this->m_DataIt)._M_current = (char *)pbVar4;
    }
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
            ::find(&(((this->m_pModel)._M_t.
                      super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                      .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                    m_MaterialMap)._M_t,&local_58);
    pMVar7 = (this->m_pModel)._M_t.
             super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
             .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
    if ((_Rb_tree_header *)iVar5._M_node ==
        (_Rb_tree_header *)((long)&(pMVar7->m_MaterialMap)._M_t + 8U)) {
      this_00 = DefaultLogger::get();
      std::operator+(&local_38,"OBJ: Unsupported material requested: ",&local_58);
      Logger::warn(this_00,local_38._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      pMVar7 = (this->m_pModel)._M_t.
               super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
               .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      pMVar7->m_pCurrentMaterial = pMVar7->m_pDefaultMaterial;
    }
    else {
      bVar2 = needsNewMesh(this,&local_58);
      if (bVar2) {
        createMesh(this,&local_58);
        pMVar7 = (this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      }
      uVar3 = getMaterialIndex(this,&local_58);
      pMVar7->m_pCurrentMesh->m_uiMaterialIndex = uVar3;
    }
    pbVar4 = (byte *)(this->m_DataIt)._M_current;
    pbVar6 = (byte *)(this->m_DataItEnd)._M_current;
    if (pbVar6 + -1 != pbVar4 && pbVar4 != pbVar6) {
      while ((0xd < *pbVar4 || ((0x3401U >> (*pbVar4 & 0x1f) & 1) == 0))) {
        pbVar4 = pbVar4 + 1;
        if ((pbVar4 == pbVar6) || (pbVar4 == pbVar6 + -1)) break;
      }
    }
    pbVar1 = pbVar4;
    if (pbVar4 != pbVar6) {
      pbVar4 = pbVar4 + 1;
      this->m_uiLine = this->m_uiLine + 1;
      pbVar1 = pbVar4;
    }
    for (; (pbVar1 != pbVar6 && ((*pbVar1 == 0x20 || (pbVar4 = pbVar1, *pbVar1 == 9))));
        pbVar1 = pbVar1 + 1) {
      pbVar4 = pbVar6;
    }
    (this->m_DataIt)._M_current = (char *)pbVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return;
LAB_004141c6:
  if ((*pbVar6 != 0x20) && (*pbVar6 != 9)) goto LAB_004141d3;
  pbVar6 = pbVar6 + 1;
  if ((pbVar6 == pbVar1) || (pbVar6 == pbVar4)) goto LAB_004141d3;
  goto LAB_004141c6;
}

Assistant:

void ObjFileParser::getNewMaterial() {
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
    m_DataIt = getNextWord<DataArrayIt>(m_DataIt, m_DataItEnd);
    if( m_DataIt == m_DataItEnd ) {
        return;
    }

    char *pStart = &(*m_DataIt);
    std::string strMat( pStart, *m_DataIt );
    while( m_DataIt != m_DataItEnd && IsSpaceOrNewLine( *m_DataIt ) ) {
        ++m_DataIt;
    }
    std::map<std::string, ObjFile::Material*>::iterator it = m_pModel->m_MaterialMap.find( strMat );
    if ( it == m_pModel->m_MaterialMap.end() ) {
        // Show a warning, if material was not found
        ASSIMP_LOG_WARN("OBJ: Unsupported material requested: " + strMat);
        m_pModel->m_pCurrentMaterial = m_pModel->m_pDefaultMaterial;
    } else {
        // Set new material
        if ( needsNewMesh( strMat ) ) {
            createMesh( strMat );
        }
        m_pModel->m_pCurrentMesh->m_uiMaterialIndex = getMaterialIndex( strMat );
    }

    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}